

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLExtensions.cpp
# Opt level: O3

void sf::priv::ensureExtensionsInit(void)

{
  GLenum GVar1;
  byte *pbVar2;
  ostream *poVar3;
  void *in_RSI;
  GLADuserptrloadfunc in_RDI;
  int majorVersion;
  GLint local_10;
  GLint local_c;
  
  if (ensureExtensionsInit()::initialized == '\0') {
    ensureExtensionsInit()::initialized = '\x01';
    gladLoadGLUserPtr(in_RDI,in_RSI);
    local_10 = 0;
    local_c = 0;
    (*sf_glad_glGetIntegerv)(0x821b,&local_10);
    (*sf_glad_glGetIntegerv)(0x821c,&local_c);
    GVar1 = (*sf_glad_glGetError)();
    if (GVar1 == 0x500) {
      pbVar2 = (*sf_glad_glGetString)(0x1f02);
      if (pbVar2 == (byte *)0x0) {
        local_10 = 1;
        local_c = 1;
      }
      else {
        local_10 = *pbVar2 - 0x30;
        local_c = pbVar2[2] - 0x30;
      }
    }
    if ((local_10 < 1) || ((local_10 == 1 && (local_c < 1)))) {
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"sfml-graphics requires support for OpenGL 1.1 or greater",0x38);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Ensure that hardware acceleration is enabled if available",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void ensureExtensionsInit()
{
    static bool initialized = false;
    if (!initialized)
    {
        initialized = true;

#ifdef SFML_OPENGL_ES
        gladLoadGLES1(reinterpret_cast<GLADloadfunc>(sf::Context::getFunction));
#else
        gladLoadGL(reinterpret_cast<GLADloadfunc>(sf::Context::getFunction));
#endif

        // Retrieve the context version number
        int majorVersion = 0;
        int minorVersion = 0;

        // Try the new way first
        glGetIntegerv(GL_MAJOR_VERSION, &majorVersion);
        glGetIntegerv(GL_MINOR_VERSION, &minorVersion);

        if (glGetError() == GL_INVALID_ENUM)
        {
            // Try the old way
            const GLubyte* version = glGetString(GL_VERSION);
            if (version)
            {
                // The beginning of the returned string is "major.minor" (this is standard)
                majorVersion = version[0] - '0';
                minorVersion = version[2] - '0';
            }
            else
            {
                // Can't get the version number, assume 1.1
                majorVersion = 1;
                minorVersion = 1;
            }
        }

        if ((majorVersion < 1) || ((majorVersion == 1) && (minorVersion < 1)))
        {
            err() << "sfml-graphics requires support for OpenGL 1.1 or greater" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;
        }
    }
}